

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

uint __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::find_index(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
             *this,vec<6U,_float> *k)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  raw_node *prVar4;
  
  if (this->m_num_valid != 0) {
    uVar2 = hash_key(this,k);
    prVar4 = (this->m_values).m_p;
    if (prVar4[uVar2].m_bits[0x1c] != '\0') {
      prVar4 = prVar4 + uVar2;
      bVar1 = vec<6U,_float>::operator==((vec<6U,_float> *)prVar4,k);
      if (bVar1) {
        return uVar2;
      }
      uVar3 = (ulong)uVar2;
      while( true ) {
        if ((int)uVar3 == 0) {
          uVar3 = (ulong)((this->m_values).m_size - 1);
          prVar4 = (this->m_values).m_p + uVar3;
        }
        else {
          uVar3 = (ulong)((int)uVar3 - 1);
          prVar4 = prVar4 + -1;
        }
        if (((uint)uVar3 == uVar2) || (prVar4->m_bits[0x1c] == '\0')) break;
        bVar1 = vec<6U,_float>::operator==((vec<6U,_float> *)prVar4,k);
        if (bVar1) {
          return (uint)uVar3;
        }
      }
    }
  }
  return (this->m_values).m_size;
}

Assistant:

inline uint find_index(const Key& k) const
        {
            if (m_num_valid)
            {
                int index = hash_key(k);
                const node* pNode = &get_node(index);

                if (pNode->state)
                {
                    if (m_equals(pNode->first, k))
                    {
                        return index;
                    }

                    const int orig_index = index;

                    for (;;)
                    {
                        if (!index)
                        {
                            index = m_values.size() - 1;
                            pNode = &get_node(index);
                        }
                        else
                        {
                            index--;
                            pNode--;
                        }

                        if (index == orig_index)
                        {
                            break;
                        }

                        if (!pNode->state)
                        {
                            break;
                        }

                        if (m_equals(pNode->first, k))
                        {
                            return index;
                        }
                    }
                }
            }

            return m_values.size();
        }